

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall
QMimeBinaryProvider::QMimeBinaryProvider
          (QMimeBinaryProvider *this,QMimeDatabasePrivate *db,QString *directory)

{
  _Rb_tree_header *p_Var1;
  Data *pDVar2;
  pointer *__ptr;
  
  (this->super_QMimeProviderBase)._vptr_QMimeProviderBase =
       (_func_int **)&PTR__QMimeProviderBase_006b3fe0;
  (this->super_QMimeProviderBase).m_db = db;
  pDVar2 = (directory->d).d;
  (this->super_QMimeProviderBase).m_directory.d.d = pDVar2;
  (this->super_QMimeProviderBase).m_directory.d.ptr = (directory->d).ptr;
  (this->super_QMimeProviderBase).m_directory.d.size = (directory->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super_QMimeProviderBase).m_overrideProvider = (QMimeProviderBase *)0x0;
  (this->super_QMimeProviderBase)._vptr_QMimeProviderBase =
       (_func_int **)&PTR__QMimeBinaryProvider_006b4078;
  p_Var1 = &(this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header;
  (this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cacheFile)._M_t.
  super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
  ._M_t.
  super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
  .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl = (CacheFile *)0x0;
  (this->m_cacheFileNames).d.d = (Data *)0x0;
  (this->m_cacheFileNames).d.ptr = (QString *)0x0;
  (this->m_cacheFileNames).d.size = 0;
  *(undefined8 *)((long)&(this->m_cacheFileNames).d.size + 1) = 0;
  *(undefined8 *)((long)&(this->m_mimetypeNames).q_hash.d + 1) = 0;
  (this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ensureLoaded(this);
  return;
}

Assistant:

QMimeBinaryProvider::QMimeBinaryProvider(QMimeDatabasePrivate *db, const QString &directory)
    : QMimeProviderBase(db, directory), m_mimetypeListLoaded(false)
{
    ensureLoaded();
}